

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

bool checkMergeDels(string *chr1,int st1,int en1,string *chr2,int st2,int en2,double RO)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  double dVar6;
  bool local_69;
  double ro2;
  double ro1;
  double len2;
  double len1;
  double overlap;
  bool closeEnough;
  double RO_local;
  int en2_local;
  int st2_local;
  string *chr2_local;
  int en1_local;
  int st1_local;
  string *chr1_local;
  
  RO_local._0_4_ = en2;
  RO_local._4_4_ = st2;
  _en2_local = chr2;
  chr2_local._0_4_ = en1;
  chr2_local._4_4_ = st1;
  _en1_local = chr1;
  bVar2 = std::operator!=(chr1,chr2);
  if (bVar2) {
    chr1_local._7_1_ = false;
  }
  else {
    iVar3 = chr2_local._4_4_ - RO_local._4_4_;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    iVar5 = (int)chr2_local - RO_local._0_4_;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    piVar4 = std::min<int>((int *)&chr2_local,(int *)&RO_local);
    iVar1 = *piVar4;
    piVar4 = std::max<int>((int *)((long)&chr2_local + 4),(int *)((long)&RO_local + 4));
    dVar6 = (double)(iVar1 - *piVar4) * 1.0;
    local_69 = RO <= dVar6 / ((double)((int)chr2_local - chr2_local._4_4_) * 1.0) &&
               RO <= dVar6 / ((double)(RO_local._0_4_ - RO_local._4_4_) * 1.0);
    chr1_local._7_1_ = local_69 || iVar3 < 6 && iVar5 < 6;
  }
  return chr1_local._7_1_;
}

Assistant:

bool checkMergeDels(const std::string &chr1, int st1, int en1, const std::string &chr2, int st2, int en2, double RO)
{
	if (chr1 != chr2)
		return false;
	bool closeEnough = (abs(st1 - st2) <= DEL_MERGE_DIS) & (abs(en1 - en2) <= DEL_MERGE_DIS);
	double overlap = 1.0 * (std::min(en1, en2) - std::max(st1, st2));
	double len1 = 1.0 * (en1 - st1);
	double len2 = 1.0 * (en2 - st2);
	double ro1 = overlap / len1;
	double ro2 = overlap / len2;
	return ((ro1 >= RO && ro2 >= RO) | closeEnough);
}